

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall DecisionNode::chooseOptimalField(DecisionNode *this)

{
  bool bVar1;
  int4 iVar2;
  int4 iVar3;
  int low;
  int iVar4;
  int iVar5;
  bool bVar6;
  double dVar7;
  double local_40;
  
  iVar4 = 1;
  local_40 = 0.0;
  bVar1 = true;
  do {
    iVar2 = getMaximumLength(this,bVar1);
    for (iVar5 = 0; iVar2 << 3 != iVar5; iVar5 = iVar5 + 1) {
      iVar3 = getNumFixed(this,iVar5,1,bVar1);
      if (iVar4 <= iVar3) {
        dVar7 = getScore(this,iVar5,1,bVar1);
        if (((iVar4 < iVar3) && (0.0 < dVar7)) || (iVar3 = iVar4, local_40 < dVar7)) {
          this->startbit = iVar5;
          this->bitsize = 1;
          this->contextdecision = bVar1;
          local_40 = dVar7;
          iVar4 = iVar3;
        }
      }
    }
    bVar6 = bVar1 != false;
    bVar1 = false;
  } while (bVar6);
  bVar1 = true;
  do {
    iVar2 = getMaximumLength(this,bVar1);
    for (iVar5 = 2; iVar5 != 9; iVar5 = iVar5 + 1) {
      for (low = 0; low <= iVar2 * 8 - iVar5; low = low + 1) {
        iVar3 = getNumFixed(this,low,iVar5,bVar1);
        if (iVar4 <= iVar3) {
          dVar7 = getScore(this,low,iVar5,bVar1);
          if (local_40 < dVar7) {
            this->startbit = low;
            this->bitsize = iVar5;
            this->contextdecision = bVar1;
            local_40 = dVar7;
          }
        }
      }
    }
    bVar6 = bVar1 != false;
    bVar1 = false;
  } while (bVar6);
  if (local_40 <= 0.0) {
    this->bitsize = 0;
  }
  return;
}

Assistant:

void DecisionNode::chooseOptimalField(void)

{
  double score = 0.0;
  
  int4 sbit,size;		// The current field
  bool context;
  double sc;

  int4 maxlength,numfixed,maxfixed;

  maxfixed = 1;
  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(sbit=0;sbit<maxlength;++sbit) {
      numfixed = getNumFixed(sbit,1,context); // How may patterns specify this bit
      if (numfixed < maxfixed) continue; // Skip this bit, if we don't have maximum specification
      sc = getScore(sbit,1,context);

 // if we got more patterns this time than previously, and a positive score, reset
 // the high score (we prefer this bit, because it has a higher numfixed, regardless
 // of the difference in score, as long as the new score is positive).
      if ((numfixed > maxfixed)&&(sc > 0.0)) {
	score = sc;
	maxfixed = numfixed;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
	continue;
      }
				// We have maximum patterns
      if (sc > score) {
	score = sc;
	startbit = sbit;
	bitsize = 1;
	contextdecision = context;
      }
    }
    context = !context;
  } while(!context);

  context = true;
  do {
    maxlength = 8*getMaximumLength(context);
    for(size=2;size <= 8;++size) {
      for(sbit=0;sbit<maxlength-size+1;++sbit) {
	if (getNumFixed(sbit,size,context) < maxfixed) continue; // Consider only maximal fields
	sc = getScore(sbit,size,context);
	if (sc > score) {
	  score = sc;
	  startbit = sbit;
	  bitsize = size;
	  contextdecision = context;
	}
      }
    }
    context = !context;
  } while(!context);
  if (score <= 0.0)		// If we failed to get a positive score
    bitsize = 0;		// treat the node as terminal
}